

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O1

void __thiscall OutputBox::Cerror(OutputBox *this,string *err,string *title)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string complete_err;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
  iVar2 = std::__cxx11::string::compare((char *)title);
  if (iVar2 != 0) {
    pcVar1 = (title->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + title->_M_string_length);
    std::__cxx11::string::append((char *)&local_88);
    PrintData(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)local_68._M_string_length,0x311c70);
  }
  std::operator+(&local_48," ERROR: [",err);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_88._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_88._M_dataplus._M_p == psVar4) {
    local_88.field_2._M_allocated_capacity = *psVar4;
    local_88.field_2._8_8_ = plVar3[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar4;
  }
  local_88._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  PrintData(this,&local_68);
  PrintSeparatorLine(this);
  exit(1);
}

Assistant:

void Cerror(const std::string& err, const std::string& title = "")
    {
        std::string complete_err = "";
        if (title != "") {
            PrintData(title + ":");
            complete_err = " ";
        }
        complete_err += " ERROR: [" + err + "]";
        PrintData(complete_err);
        PrintSeparatorLine();
        exit(EXIT_FAILURE);

        /*

        If the title is specified this function will print:

        | title:                                                                     |
        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        otherwise:

        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        */
    }